

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::COpenGLCoreRenderTarget
          (COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this,COpenGLDriver *driver)

{
  E_DRIVER_TYPE EVar1;
  u32 uVar2;
  undefined8 *puVar3;
  COpenGLCoreFeature *pCVar4;
  uint *puVar5;
  COpenGLExtensionHandler *in_RSI;
  IRenderTarget *in_RDI;
  u32 i;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  GLsizei in_stack_ffffffffffffffec;
  uint index;
  uint uVar6;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI[1].DepthStencil);
  IRenderTarget::IRenderTarget
            (in_RDI,(void **)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  in_RDI->_vptr_IRenderTarget = (_func_int **)0x43cd40;
  in_RDI[1].DepthStencil =
       (ITexture *)
       (COpenGLCoreRenderTarget<irr::video::COpenGLDriver,irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>>
        ::vtable + 0x48);
  core::array<unsigned_int>::array((array<unsigned_int> *)in_RDI);
  *(undefined1 *)
   &in_RDI[1].Textures.m_data.
    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].Textures.m_data.
           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].Textures.m_data.
           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 2) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].Textures.m_data.
           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 3) = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].Textures.m_data.
           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  core::dimension2d<unsigned_int>::dimension2d
            ((dimension2d<unsigned_int> *)
             &in_RDI[1].Textures.m_data.
              super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  *(undefined4 *)
   &in_RDI[1].Textures.m_data.
    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].Textures.m_data.
           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(COpenGLExtensionHandler **)&in_RDI[1].Textures.is_sorted = in_RSI;
  EVar1 = (**(code **)(**(long **)&in_RDI[1].Textures.is_sorted + 0x2a0))();
  in_RDI->DriverType = EVar1;
  puVar3 = (undefined8 *)(**(code **)(**(long **)&in_RDI[1].Textures.is_sorted + 0x1d8))();
  in_RDI[1].Textures.m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)*puVar3;
  pCVar4 = COpenGLExtensionHandler::getFeature
                     ((COpenGLExtensionHandler *)(*(long *)&in_RDI[1].Textures.is_sorted + 0x498));
  *(uint *)&in_RDI[1].Textures.m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (uint)pCVar4->ColorAttachment;
  pCVar4 = COpenGLExtensionHandler::getFeature
                     ((COpenGLExtensionHandler *)(*(long *)&in_RDI[1].Textures.is_sorted + 0x498));
  *(uint *)((long)&in_RDI[1].Textures.m_data.
                   super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
       (uint)pCVar4->MultipleRenderTarget;
  if (*(int *)&in_RDI[1].Textures.m_data.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
    COpenGLExtensionHandler::irrGlGenFramebuffers(in_RSI,in_stack_ffffffffffffffec,(GLuint *)in_RDI)
    ;
  }
  core::array<unsigned_int>::set_used((array<unsigned_int> *)in_RDI,in_stack_ffffffffffffffdc);
  index = 0;
  while( true ) {
    uVar6 = index;
    uVar2 = core::array<unsigned_int>::size((array<unsigned_int> *)0x344c09);
    if (uVar2 <= index) break;
    puVar5 = core::array<unsigned_int>::operator[]((array<unsigned_int> *)in_RDI,index);
    *puVar5 = 0;
    index = uVar6 + 1;
  }
  return;
}

Assistant:

COpenGLCoreRenderTarget(TOpenGLDriver *driver) :
			AssignedDepth(false), AssignedStencil(false), RequestTextureUpdate(false), RequestDepthStencilUpdate(false),
			BufferID(0), ColorAttachment(0), MultipleRenderTarget(0), Driver(driver)
	{
#ifdef _DEBUG
		setDebugName("COpenGLCoreRenderTarget");
#endif

		DriverType = Driver->getDriverType();

		Size = Driver->getScreenSize();

		ColorAttachment = Driver->getFeature().ColorAttachment;
		MultipleRenderTarget = Driver->getFeature().MultipleRenderTarget;

		if (ColorAttachment > 0)
			Driver->irrGlGenFramebuffers(1, &BufferID);

		AssignedTextures.set_used(static_cast<u32>(ColorAttachment));

		for (u32 i = 0; i < AssignedTextures.size(); ++i)
			AssignedTextures[i] = GL_NONE;
	}